

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> * __thiscall
despot::BaseRockSample::ComputeOptimalSamplingPolicy(BaseRockSample *this)

{
  pointer pVVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  clock_t cVar6;
  ostream *poVar7;
  clock_t cVar8;
  long lVar9;
  int a;
  ulong uVar10;
  int s;
  size_type __n;
  ulong uVar11;
  int s_1;
  long lVar12;
  double dVar13;
  allocator_type local_99;
  double local_98;
  ulong local_90;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *local_88;
  ulong local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  transition;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  
  uVar4 = (**(code **)(*(long *)this + 0x10))();
  local_88 = &this->mdp_policy_;
  __n = (size_type)(int)uVar4;
  if ((long)(this->mdp_policy_).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->mdp_policy_).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 != __n) {
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
               &next_policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>,__n,
               (allocator_type *)&transition);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::_M_move_assign
              (local_88,&next_policy.
                         super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
              );
    std::_Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~_Vector_base
              (&next_policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>);
    pVVar1 = (local_88->
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0;
    local_80 = 0;
    if (0 < (int)uVar4) {
      local_80 = (ulong)uVar4;
    }
    lVar12 = local_80 << 4;
    for (; lVar12 != lVar9; lVar9 = lVar9 + 0x10) {
      *(undefined8 *)(pVVar1 + lVar9 + 8) = 0;
    }
    cVar6 = clock();
    std::operator<<((ostream *)&std::cerr,"Computing optimal MDP policy...");
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              (&next_policy,__n,(allocator_type *)&transition);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&transition,__n,&local_99);
    for (uVar11 = 0; uVar3 = Globals::NEG_INFTY, uVar11 != local_80; uVar11 = uVar11 + 1) {
      std::vector<int,_std::allocator<int>_>::resize
                (transition.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11,5);
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        iVar5 = NextState(this,(int)uVar11,(ACT_TYPE)lVar9);
        transition.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar9] = iVar5;
      }
    }
    local_90 = 0;
    do {
      for (uVar11 = 0; uVar11 != local_80; uVar11 = uVar11 + 1) {
        lVar9 = uVar11 * 0x10;
        *(undefined4 *)
         (next_policy.
          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
          super__Vector_impl_data._M_start + lVar9) = 0xffffffff;
        *(undefined8 *)
         (next_policy.
          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
          super__Vector_impl_data._M_start + lVar9 + 8) = uVar3;
        for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
          dVar13 = (double)(**(code **)(*(long *)this + 0x28))
                                     (this,uVar11 & 0xffffffff,uVar10 & 0xffffffff);
          dVar13 = _ParticleBelief *
                   *(double *)
                    ((local_88->
                     super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                     )._M_impl.super__Vector_impl_data._M_start +
                    (long)transition.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10] * 0x10 + 8) + dVar13;
          if (*(double *)
               (next_policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar9 + 8) <= dVar13 &&
              dVar13 != *(double *)
                         (next_policy.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar9 + 8)) {
            *(double *)
             (next_policy.
              super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar9 + 8) = dVar13;
            *(int *)(next_policy.
                     super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9) = (int)uVar10;
          }
        }
      }
      local_98 = 0.0;
      for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 0x10) {
        pVVar1 = (local_88->
                 super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_98 = local_98 +
                   ABS(*(double *)
                        (next_policy.
                         super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9 + 8) -
                       *(double *)(pVVar1 + lVar9 + 8));
        uVar2 = *(undefined8 *)
                 (next_policy.
                  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar9 + 8);
        pVVar1 = pVVar1 + lVar9;
        *(undefined8 *)pVVar1 =
             *(undefined8 *)
              (next_policy.
               super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar9);
        *(undefined8 *)(pVVar1 + 8) = uVar2;
      }
      local_90 = (ulong)((int)local_90 + 1);
    } while (0.001 <= local_98);
    poVar7 = std::operator<<((ostream *)&std::cerr,"Done [");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)local_90);
    std::operator<<(poVar7," iters, tol = ");
    poVar7 = std::ostream::_M_insert<double>(local_98);
    std::operator<<(poVar7,", ");
    cVar8 = clock();
    poVar7 = std::ostream::_M_insert<double>((double)(cVar8 - cVar6) / 1000000.0);
    poVar7 = std::operator<<(poVar7,"s]!");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&transition);
    std::_Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~_Vector_base
              (&next_policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>);
  }
  return local_88;
}

Assistant:

vector<ValuedAction>& BaseRockSample::ComputeOptimalSamplingPolicy() const {
	int num_states = NumStates();
	if (mdp_policy_.size() == num_states)
		return mdp_policy_;

	mdp_policy_ = vector<ValuedAction>(num_states);
	for (int s = 0; s < num_states; s++) {
		mdp_policy_[s].value = 0;
	}

	clock_t start = clock();
	cerr << "Computing optimal MDP policy...";
	vector<ValuedAction> next_policy = vector<ValuedAction>(num_states);
	// Using precomputed transition saves around 60% of the time
	vector<vector<int> > transition = vector<vector<int> >(num_states);
	for (int s = 0; s < num_states; s++) {
		transition[s].resize(E_SAMPLE + 1);
		for (int a = 0; a <= E_SAMPLE; a++) // Sensing actions not needed
			transition[s][a] = NextState(s, a);
	}

	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < num_states; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a <= E_SAMPLE; a++) {
				double v = Reward(s, a)
					+ Globals::Discount() * mdp_policy_[transition[s][a]].value;

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < num_states; s++) {
			diff += fabs(next_policy[s].value - mdp_policy_[s].value);
			mdp_policy_[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}
	cerr << "Done [" << iter << " iters, tol = " << diff << ", "
		<< (double) (clock() - start) / CLOCKS_PER_SEC << "s]!" << endl;

	return mdp_policy_;
}